

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswmcpl.c
# Opt level: O0

void ssw_writerecord(mcpl_generic_wfilehandle_t *fh,int reclen,size_t lbuf,char *buf)

{
  undefined8 in_RCX;
  ulong in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  uint64_t rl_1;
  uint32_t rl;
  undefined1 local_30 [12];
  undefined4 local_24;
  undefined8 local_20;
  ulong local_18;
  undefined8 local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  if (in_ESI == 4) {
    if (0xffffffff < in_RDX) {
      ssw_error((char *)0x105836);
    }
    local_24 = (undefined4)local_18;
    mcpl_generic_fwrite(local_8,&local_24,4);
    mcpl_generic_fwrite(local_8,local_20,local_18);
    mcpl_generic_fwrite(local_8,&local_24,4);
  }
  else {
    mcpl_generic_fwrite(in_RDI,local_30,8);
    mcpl_generic_fwrite(local_8,local_20,local_18);
    mcpl_generic_fwrite(local_8,local_30,8);
  }
  return;
}

Assistant:

void ssw_writerecord( mcpl_generic_wfilehandle_t* fh,
                      int reclen, size_t lbuf, char* buf )
{
  if (reclen==4) {
    if ( lbuf > UINT32_MAX )
      ssw_error("output record size too large for 32bit records");
    uint32_t rl = (uint32_t)lbuf;
    mcpl_generic_fwrite( fh, (char*)&rl, sizeof(rl) );
    mcpl_generic_fwrite( fh, buf, lbuf );
    mcpl_generic_fwrite( fh, (char*)&rl, sizeof(rl) );
  } else {
    assert(reclen==8);
    uint64_t rl = lbuf;
    mcpl_generic_fwrite( fh, (char*)&rl, sizeof(rl) );
    mcpl_generic_fwrite( fh, buf, lbuf );
    mcpl_generic_fwrite( fh, (char*)&rl, sizeof(rl) );
  }
}